

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hypatia.h
# Opt level: O1

matrix3 * matrix3_translatev2(matrix3 *self,vector2 *translation)

{
  matrix3 translationMatrix;
  anon_union_72_5_d0a4420b_for_matrix3_0 local_50;
  
  local_50.m[0] = 1.0;
  local_50.m[1] = 0.0;
  local_50.m[3] = 0.0;
  local_50.m[4] = 1.0;
  local_50.m[6] = 0.0;
  local_50.m[7] = 0.0;
  local_50.m[8] = 1.0;
  local_50.m[2] = (translation->field_0).v[0];
  local_50.m[5] = (translation->field_0).v[1];
  matrix3_multiply(self,(matrix3 *)&local_50.field_1);
  return self;
}

Assistant:

HYPAPI struct matrix3 *matrix3_translatev2(struct matrix3 *self, const struct vector2 *translation)
{
	struct matrix3 translationMatrix;

	return matrix3_multiply(self,
		matrix3_make_transformation_translationv2(&translationMatrix, translation));
}